

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,Script *script,string_view source_filename,
                 string_view module_filename_noext,WriteBinaryOptions *options,
                 vector<wabt::FilenameMemoryStreamPair,_std::allocator<wabt::FilenameMemoryStreamPair>_>
                 *out_module_streams,Stream *log_stream)

{
  Result RVar1;
  undefined1 local_110 [8];
  BinaryWriterSpec binary_writer_spec;
  function<wabt::Stream_*(wabt::string_view)> local_68;
  char *local_48;
  size_type sStack_40;
  Script *local_38;
  
  binary_writer_spec.num_modules_ = (size_t)&out_module_streams;
  local_38 = script;
  std::function<wabt::Stream_*(wabt::string_view)>::function
            (&local_68,
             (function<wabt::Stream_*(wabt::string_view)> *)&binary_writer_spec.num_modules_);
  local_48 = module_filename_noext.data_;
  sStack_40 = module_filename_noext.size_;
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            ((BinaryWriterSpec *)local_110,json_stream,&local_68,source_filename,
             module_filename_noext,options);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  RVar1 = anon_unknown_1::BinaryWriterSpec::WriteScript((BinaryWriterSpec *)local_110,local_38);
  anon_unknown_1::BinaryWriterSpec::~BinaryWriterSpec((BinaryWriterSpec *)local_110);
  std::_Function_base::~_Function_base((_Function_base *)&binary_writer_spec.num_modules_);
  return (Result)RVar1.enum_;
}

Assistant:

Result WriteBinarySpecScript(
    Stream* json_stream,
    Script* script,
    string_view source_filename,
    string_view module_filename_noext,
    const WriteBinaryOptions& options,
    std::vector<FilenameMemoryStreamPair>* out_module_streams,
    Stream* log_stream) {
  WriteBinarySpecStreamFactory module_stream_factory =
      [&](string_view filename) {
        out_module_streams->emplace_back(filename,
                                         MakeUnique<MemoryStream>(log_stream));
        return out_module_streams->back().stream.get();
      };

  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}